

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::_::EagerPromiseNode<kj::_::Void>_> __thiscall
kj::heap<kj::_::EagerPromiseNode<kj::_::Void>,kj::Own<kj::_::PromiseNode>>
          (kj *this,Own<kj::_::PromiseNode> *params)

{
  EagerPromiseNode<kj::_::Void> *this_00;
  EagerPromiseNode<kj::_::Void> *extraout_RDX;
  Own<kj::_::EagerPromiseNode<kj::_::Void>_> OVar1;
  
  this_00 = (EagerPromiseNode<kj::_::Void> *)operator_new(0x1b8);
  _::EagerPromiseNode<kj::_::Void>::EagerPromiseNode(this_00,params);
  *(undefined8 **)this = &_::HeapDisposer<kj::_::EagerPromiseNode<kj::_::Void>>::instance;
  *(EagerPromiseNode<kj::_::Void> **)(this + 8) = this_00;
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}